

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

uint32_t PollEvent2Epoll(short events)

{
  uint local_10;
  uint32_t e;
  short events_local;
  
  local_10 = (uint)((events & 1U) != 0);
  if ((events & 4U) != 0) {
    local_10 = local_10 | 4;
  }
  if ((events & 0x10U) != 0) {
    local_10 = local_10 | 0x10;
  }
  if ((events & 8U) != 0) {
    local_10 = local_10 | 8;
  }
  if ((events & 0x40U) != 0) {
    local_10 = local_10 | 0x40;
  }
  if ((events & 0x100U) != 0) {
    local_10 = local_10 | 0x100;
  }
  return local_10;
}

Assistant:

static uint32_t PollEvent2Epoll( short events )
{
	uint32_t e = 0;	
	if( events & POLLIN ) 	e |= EPOLLIN;
	if( events & POLLOUT )  e |= EPOLLOUT;
	if( events & POLLHUP ) 	e |= EPOLLHUP;
	if( events & POLLERR )	e |= EPOLLERR;
	if( events & POLLRDNORM ) e |= EPOLLRDNORM;
	if( events & POLLWRNORM ) e |= EPOLLWRNORM;
	return e;
}